

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O1

uint32_t * FastPForLib::__fastunpack29_16(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  uVar1 = *in;
  *out = uVar1 & 0x1fffffff;
  uVar2 = in[1];
  out[1] = uVar1 >> 0x1d;
  out[1] = uVar1 >> 0x1d | (uVar2 & 0x3ffffff) << 3;
  out[2] = uVar2 >> 0x1a;
  uVar1 = in[2];
  uVar3 = in[3];
  out[2] = uVar2 >> 0x1a | (uVar1 & 0x7fffff) << 6;
  out[3] = uVar1 >> 0x17;
  out[3] = uVar1 >> 0x17 | (uVar3 & 0xfffff) << 9;
  uVar1 = in[4];
  out[4] = uVar3 >> 0x14;
  out[4] = uVar3 >> 0x14 | (uVar1 & 0x1ffff) << 0xc;
  out[5] = uVar1 >> 0x11;
  uVar2 = in[5];
  uVar3 = in[6];
  out[5] = uVar1 >> 0x11 | (uVar2 & 0x3fff) << 0xf;
  out[6] = uVar2 >> 0xe;
  out[6] = uVar2 >> 0xe | (uVar3 & 0x7ff) << 0x12;
  uVar1 = in[7];
  out[7] = uVar3 >> 0xb;
  out[7] = uVar3 >> 0xb | (uVar1 & 0xff) << 0x15;
  out[8] = uVar1 >> 8;
  uVar2 = in[8];
  uVar3 = in[9];
  out[8] = uVar1 >> 8 | (uVar2 & 0x1f) << 0x18;
  out[9] = uVar2 >> 5;
  out[9] = uVar2 >> 5 | (uVar3 & 3) << 0x1b;
  out[10] = uVar3 >> 2 & 0x1fffffff;
  out[0xb] = uVar3 >> 0x1f;
  uVar1 = in[10];
  out[0xb] = uVar3 >> 0x1f | (uVar1 & 0xfffffff) << 1;
  uVar2 = in[0xb];
  out[0xc] = uVar1 >> 0x1c;
  out[0xc] = uVar1 >> 0x1c | (uVar2 & 0x1ffffff) << 4;
  out[0xd] = uVar2 >> 0x19;
  uVar1 = in[0xc];
  out[0xd] = uVar2 >> 0x19 | (uVar1 & 0x3fffff) << 7;
  out[0xe] = uVar1 >> 0x16;
  uVar2 = in[0xd];
  out[0xe] = uVar1 >> 0x16 | (uVar2 & 0x7ffff) << 10;
  uVar1 = in[0xe];
  out[0xf] = uVar2 >> 0x13;
  out[0xf] = (uVar1 & 0xffff) << 0xd | uVar2 >> 0x13;
  return in + 0xf;
}

Assistant:

const uint32_t *__fastunpack29_16(const uint32_t *__restrict__ in,
                                  uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 29);
  out++;
  *out = ((*in) >> 29);
  ++in;
  *out |= ((*in) % (1U << 26)) << (29 - 26);
  out++;
  *out = ((*in) >> 26);
  ++in;
  *out |= ((*in) % (1U << 23)) << (29 - 23);
  out++;
  *out = ((*in) >> 23);
  ++in;
  *out |= ((*in) % (1U << 20)) << (29 - 20);
  out++;
  *out = ((*in) >> 20);
  ++in;
  *out |= ((*in) % (1U << 17)) << (29 - 17);
  out++;
  *out = ((*in) >> 17);
  ++in;
  *out |= ((*in) % (1U << 14)) << (29 - 14);
  out++;
  *out = ((*in) >> 14);
  ++in;
  *out |= ((*in) % (1U << 11)) << (29 - 11);
  out++;
  *out = ((*in) >> 11);
  ++in;
  *out |= ((*in) % (1U << 8)) << (29 - 8);
  out++;
  *out = ((*in) >> 8);
  ++in;
  *out |= ((*in) % (1U << 5)) << (29 - 5);
  out++;
  *out = ((*in) >> 5);
  ++in;
  *out |= ((*in) % (1U << 2)) << (29 - 2);
  out++;
  *out = ((*in) >> 2) % (1U << 29);
  out++;
  *out = ((*in) >> 31);
  ++in;
  *out |= ((*in) % (1U << 28)) << (29 - 28);
  out++;
  *out = ((*in) >> 28);
  ++in;
  *out |= ((*in) % (1U << 25)) << (29 - 25);
  out++;
  *out = ((*in) >> 25);
  ++in;
  *out |= ((*in) % (1U << 22)) << (29 - 22);
  out++;
  *out = ((*in) >> 22);
  ++in;
  *out |= ((*in) % (1U << 19)) << (29 - 19);
  out++;
  *out = ((*in) >> 19);
  ++in;
  *out |= ((*in) % (1U << 16)) << (29 - 16);
  out++;

  return in + 1;
}